

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O2

RayTracingPipelineStateCreateInfoX * __thiscall
Diligent::RayTracingPipelineStateCreateInfoX::SyncDesc
          (RayTracingPipelineStateCreateInfoX *this,SYNC_FLAGS UpdateFlags)

{
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar1;
  Char **ppCVar2;
  vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  *this_00;
  pointer pRVar3;
  pointer pRVar4;
  RayTracingGeneralShaderGroup *pRVar5;
  RayTracingTriangleHitShaderGroup *pRVar6;
  RayTracingProceduralHitShaderGroup *pRVar7;
  Uint32 UVar8;
  pointer pRVar9;
  pointer pRVar10;
  iterator __begin3;
  pointer pRVar11;
  pointer pRVar12;
  IShader **ppIVar13;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar14;
  vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  local_48;
  
  pRVar12 = (pointer)(this->GeneralShaders).
                     super__Vector_base<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  pRVar3 = (pointer)(this->GeneralShaders).
                    super__Vector_base<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  UVar8 = (Uint32)((ulong)((long)pRVar3 - (long)pRVar12) >> 4);
  (this->
  super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  ).super_RayTracingPipelineStateCreateInfo.GeneralShaderCount = UVar8;
  pRVar9 = (pointer)0x0;
  pRVar10 = pRVar12;
  if (UVar8 == 0) {
    pRVar10 = pRVar9;
  }
  (this->
  super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  ).super_RayTracingPipelineStateCreateInfo.pGeneralShaders =
       (RayTracingGeneralShaderGroup *)pRVar10;
  pRVar10 = (pointer)(this->TriangleHitShaders).
                     super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  UVar8 = (Uint32)(((long)(this->TriangleHitShaders).
                          super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar10) / 0x18);
  if (UVar8 == 0) {
    pRVar10 = pRVar9;
  }
  (this->
  super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  ).super_RayTracingPipelineStateCreateInfo.TriangleHitShaderCount = UVar8;
  (this->
  super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  ).super_RayTracingPipelineStateCreateInfo.pTriangleHitShaders =
       (RayTracingTriangleHitShaderGroup *)pRVar10;
  pRVar10 = (this->ProceduralHitShaders).
            super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
            ._M_impl.super__Vector_impl_data._M_start;
  UVar8 = (Uint32)((ulong)((long)(this->ProceduralHitShaders).
                                 super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar10) >> 5);
  (this->
  super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  ).super_RayTracingPipelineStateCreateInfo.ProceduralHitShaderCount = UVar8;
  if (UVar8 == 0) {
    pRVar10 = pRVar9;
  }
  (this->
  super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  ).super_RayTracingPipelineStateCreateInfo.pProceduralHitShaders = pRVar10;
  if ((UpdateFlags & SYNC_FLAG_UPDATE_STRINGS) != SYNC_FLAG_NONE) {
    puVar1 = &(this->
              super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
              ).StringPool;
    for (; pRVar12 != pRVar3; pRVar12 = (pointer)&pRVar12->pClosestHitShader) {
      pVar14 = std::
               _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               ::_M_emplace<char_const*&>
                         ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                           *)puVar1,pRVar12,pRVar10);
      pRVar10 = pVar14._8_8_;
      pRVar12->Name =
           *(Char **)((long)pVar14.first.
                            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            ._M_cur.
                            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     + 8);
    }
    pRVar4 = (this->TriangleHitShaders).
             super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pRVar11 = (this->TriangleHitShaders).
                   super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
                   ._M_impl.super__Vector_impl_data._M_start; pRVar11 != pRVar4;
        pRVar11 = pRVar11 + 1) {
      pVar14 = std::
               _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               ::_M_emplace<char_const*&>
                         ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                           *)puVar1,pRVar11,pRVar10);
      pRVar10 = pVar14._8_8_;
      pRVar11->Name =
           *(Char **)((long)pVar14.first.
                            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            ._M_cur.
                            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     + 8);
    }
    pRVar3 = (this->ProceduralHitShaders).
             super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pRVar12 = (this->ProceduralHitShaders).
                   super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
                   ._M_impl.super__Vector_impl_data._M_start; pRVar12 != pRVar3;
        pRVar12 = pRVar12 + 1) {
      pVar14 = std::
               _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               ::_M_emplace<char_const*&>
                         ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                           *)puVar1,pRVar12,pRVar10);
      pRVar10 = pVar14._8_8_;
      pRVar12->Name =
           *(Char **)((long)pVar14.first.
                            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            ._M_cur.
                            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     + 8);
    }
    if ((this->
        super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
        ).super_RayTracingPipelineStateCreateInfo.pShaderRecordName != (Char *)0x0) {
      ppCVar2 = &(this->
                 super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
                 ).super_RayTracingPipelineStateCreateInfo.pShaderRecordName;
      pVar14 = std::
               _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               ::_M_emplace<char_const*&>
                         ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                           *)puVar1,ppCVar2,pRVar10);
      *ppCVar2 = *(Char **)((long)pVar14.first.
                                  super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                  ._M_cur.
                                  super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                           + 8);
    }
  }
  if ((UpdateFlags & SYNC_FLAG_UPDATE_SHADERS) != SYNC_FLAG_NONE) {
    this_00 = &this->ShaderObjects;
    local_48.
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (this->ShaderObjects).
         super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (this->ShaderObjects).
         super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->ShaderObjects).
         super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->ShaderObjects).
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->ShaderObjects).
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->ShaderObjects).
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
    ::clear(this_00);
    pRVar5 = (this->GeneralShaders).
             super__Vector_base<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar13 = &((this->GeneralShaders).
                      super__Vector_base<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
                      ._M_impl.super__Vector_impl_data._M_start)->pShader;
        (RayTracingGeneralShaderGroup *)(ppIVar13 + -1) != pRVar5; ppIVar13 = ppIVar13 + 2) {
      if (*ppIVar13 != (IShader *)0x0) {
        std::
        vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
        ::emplace_back<Diligent::IShader*&>
                  ((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
                    *)this_00,ppIVar13);
      }
    }
    pRVar6 = (this->TriangleHitShaders).
             super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar13 = &((this->TriangleHitShaders).
                      super__Vector_base<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
                      ._M_impl.super__Vector_impl_data._M_start)->pAnyHitShader;
        (RayTracingTriangleHitShaderGroup *)(ppIVar13 + -2) != pRVar6; ppIVar13 = ppIVar13 + 3) {
      if (ppIVar13[-1] != (IShader *)0x0) {
        std::
        vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
        ::emplace_back<Diligent::IShader*&>
                  ((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
                    *)this_00,ppIVar13 + -1);
      }
      if (*ppIVar13 != (IShader *)0x0) {
        std::
        vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
        ::emplace_back<Diligent::IShader*&>
                  ((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
                    *)this_00,ppIVar13);
      }
    }
    pRVar7 = (this->ProceduralHitShaders).
             super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar13 = &((this->ProceduralHitShaders).
                      super__Vector_base<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
                      ._M_impl.super__Vector_impl_data._M_start)->pAnyHitShader;
        (RayTracingProceduralHitShaderGroup *)(ppIVar13 + -3) != pRVar7; ppIVar13 = ppIVar13 + 4) {
      if (ppIVar13[-2] != (IShader *)0x0) {
        std::
        vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
        ::emplace_back<Diligent::IShader*&>
                  ((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
                    *)this_00,ppIVar13 + -2);
      }
      if (ppIVar13[-1] != (IShader *)0x0) {
        std::
        vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
        ::emplace_back<Diligent::IShader*&>
                  ((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
                    *)this_00,ppIVar13 + -1);
      }
      if (*ppIVar13 != (IShader *)0x0) {
        std::
        vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
        ::emplace_back<Diligent::IShader*&>
                  ((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
                    *)this_00,ppIVar13);
      }
    }
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
    ::~vector(&local_48);
  }
  return this;
}

Assistant:

RayTracingPipelineStateCreateInfoX& SyncDesc(SYNC_FLAGS UpdateFlags)
    {
        GeneralShaderCount = static_cast<Uint32>(GeneralShaders.size());
        pGeneralShaders    = GeneralShaderCount > 0 ? GeneralShaders.data() : nullptr;

        TriangleHitShaderCount = static_cast<Uint32>(TriangleHitShaders.size());
        pTriangleHitShaders    = TriangleHitShaderCount > 0 ? TriangleHitShaders.data() : nullptr;

        ProceduralHitShaderCount = static_cast<Uint32>(ProceduralHitShaders.size());
        pProceduralHitShaders    = ProceduralHitShaderCount > 0 ? ProceduralHitShaders.data() : nullptr;

        if ((UpdateFlags & SYNC_FLAG_UPDATE_STRINGS) != 0)
        {
            for (auto& Shader : GeneralShaders)
                Shader.Name = StringPool.emplace(Shader.Name).first->c_str();

            for (auto& Shader : TriangleHitShaders)
                Shader.Name = StringPool.emplace(Shader.Name).first->c_str();

            for (auto& Shader : ProceduralHitShaders)
                Shader.Name = StringPool.emplace(Shader.Name).first->c_str();

            if (pShaderRecordName != nullptr)
                pShaderRecordName = StringPool.emplace(pShaderRecordName).first->c_str();
        }

        if ((UpdateFlags & SYNC_FLAG_UPDATE_SHADERS) != 0)
        {
            // Keep current shader objects alive
            std::vector<RefCntAutoPtr<IShader>> OldShaderObjects = std::move(ShaderObjects);

            ShaderObjects.clear();
            for (auto& Shader : GeneralShaders)
            {
                if (Shader.pShader != nullptr)
                    ShaderObjects.emplace_back(Shader.pShader);
            }

            for (auto& Shader : TriangleHitShaders)
            {
                if (Shader.pClosestHitShader != nullptr)
                    ShaderObjects.emplace_back(Shader.pClosestHitShader);
                if (Shader.pAnyHitShader != nullptr)
                    ShaderObjects.emplace_back(Shader.pAnyHitShader);
            }

            for (auto& Shader : ProceduralHitShaders)
            {
                if (Shader.pIntersectionShader != nullptr)
                    ShaderObjects.emplace_back(Shader.pIntersectionShader);
                if (Shader.pClosestHitShader != nullptr)
                    ShaderObjects.emplace_back(Shader.pClosestHitShader);
                if (Shader.pAnyHitShader != nullptr)
                    ShaderObjects.emplace_back(Shader.pAnyHitShader);
            }
        }

        return *this;
    }